

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.h
# Opt level: O0

bool google::protobuf::util::TimeUtil::IsDurationValid(Duration *duration)

{
  int32_t iVar1;
  int64_t iVar2;
  ulong uVar3;
  undefined1 local_12;
  undefined1 local_11;
  Duration *duration_local;
  
  iVar2 = Duration::seconds(duration);
  local_11 = 0;
  if (iVar2 < 0x4979cb9e01) {
    iVar2 = Duration::seconds(duration);
    local_11 = 0;
    if (-0x4979cb9e01 < iVar2) {
      iVar1 = Duration::nanos(duration);
      local_11 = 0;
      if (iVar1 < 1000000000) {
        iVar1 = Duration::nanos(duration);
        local_11 = 0;
        if (-1000000000 < iVar1) {
          iVar2 = Duration::seconds(duration);
          if (0 < iVar2) {
            iVar1 = Duration::nanos(duration);
            local_11 = 0;
            if (iVar1 < 0) goto LAB_011cff19;
          }
          uVar3 = Duration::seconds(duration);
          local_12 = false;
          if (0x7fffffffffffffff < uVar3) {
            iVar1 = Duration::nanos(duration);
            local_12 = 0 < iVar1;
          }
          local_11 = local_12 ^ 0xff;
        }
      }
    }
  }
LAB_011cff19:
  return (bool)(local_11 & 1);
}

Assistant:

static bool IsDurationValid(const Duration& duration) {
    return duration.seconds() <= kDurationMaxSeconds &&
           duration.seconds() >= kDurationMinSeconds &&
           duration.nanos() <= kDurationMaxNanoseconds &&
           duration.nanos() >= kDurationMinNanoseconds &&
           !(duration.seconds() >= 1 && duration.nanos() < 0) &&
           !(duration.seconds() <= -1 && duration.nanos() > 0);
  }